

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cfg.cpp
# Opt level: O1

MPP_RET check_cfg_info(MppCfgInfo *node,char *name,CfgType type,char *func)

{
  CfgType CVar1;
  uint uVar2;
  MPP_RET MVar3;
  char *fmt;
  ulong uVar4;
  char *pcVar5;
  
  if (node == (MppCfgInfo *)0x0) {
    _mpp_log_l(2,"mpp_cfg","%s: cfg %s is invalid\n",(char *)0x0,func,name);
    return MPP_NOK;
  }
  if (type < CFG_FUNC_TYPE_BUTT) {
    CVar1 = node->data_type;
    uVar2 = node->data_size;
    pcVar5 = (char *)(ulong)uVar2;
    switch((char *)(ulong)type) {
    default:
      if (uVar2 == 4) {
        return MPP_OK;
      }
      break;
    case (char *)0x2:
    case (char *)0x3:
      if (uVar2 == 8) {
        return MPP_OK;
      }
      break;
    case (char *)0x4:
      MVar3 = MPP_OK;
      if (CVar1 != CFG_FUNC_TYPE_St) {
        uVar4 = 6;
        if (CVar1 < CFG_FUNC_TYPE_BUTT) {
          uVar4 = (ulong)CVar1;
        }
        _mpp_log_l(2,"mpp_cfg","%s cfg %s expect %s input NOT %s\n",(char *)0x0,func,name,
                   strof_cfg_type::cfg_type_names[uVar4],"struct");
        MVar3 = MPP_NOK;
      }
      if (0 < (int)uVar2) {
        return MVar3;
      }
      fmt = "%s: cfg %s found invalid size %d\n";
      goto LAB_00164232;
    case (char *)0x5:
      if (CVar1 == CFG_FUNC_TYPE_Ptr) {
        return MPP_OK;
      }
      uVar4 = 6;
      if (CVar1 < CFG_FUNC_TYPE_BUTT) {
        uVar4 = (ulong)CVar1;
      }
      _mpp_log_l(2,"mpp_cfg","%s cfg %s expect %s input NOT %s\n",(char *)0x0,func,name,
                 strof_cfg_type::cfg_type_names[uVar4],"void *");
      return MPP_NOK;
    }
    if (CFG_FUNC_TYPE_Ptr < CVar1) {
      CVar1 = CFG_FUNC_TYPE_BUTT;
    }
    fmt = "%s cfg %s expect %s input NOT %s\n";
    pcVar5 = strof_cfg_type::cfg_type_names[CVar1];
  }
  else {
    fmt = "%s: cfg %s found invalid cfg type %d\n";
    pcVar5 = (char *)(ulong)type;
  }
LAB_00164232:
  _mpp_log_l(2,"mpp_cfg",fmt,(char *)0x0,func,name,pcVar5);
  return MPP_NOK;
}

Assistant:

MPP_RET check_cfg_info(MppCfgInfo *node, const char *name, CfgType type,
                       const char *func)
{
    if (NULL == node) {
        mpp_err("%s: cfg %s is invalid\n", func, name);
        return MPP_NOK;
    }

    CfgType cfg_type = (CfgType)node->data_type;
    RK_S32 cfg_size = node->data_size;
    MPP_RET ret = MPP_OK;

    switch (type) {
    case CFG_FUNC_TYPE_St : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
        if (cfg_size <= 0) {
            mpp_err("%s: cfg %s found invalid size %d\n", func, name, cfg_size);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_Ptr : {
        if (cfg_type != type) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S32 :
    case CFG_FUNC_TYPE_U32 : {
        if (cfg_size != sizeof(RK_S32)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    case CFG_FUNC_TYPE_S64 :
    case CFG_FUNC_TYPE_U64 : {
        if (cfg_size != sizeof(RK_S64)) {
            show_cfg_info_err(node, type, func, name);
            ret = MPP_NOK;
        }
    } break;
    default : {
        mpp_err("%s: cfg %s found invalid cfg type %d\n", func, name, type);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}